

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O0

bool_t CallDelete(nodecontext *p,node *Node,nodeclass *Class)

{
  size_t sVar1;
  thisnode p_00;
  undefined8 *puVar2;
  bool_t bVar3;
  node *v;
  node **Ptr_1;
  array *Ptr;
  nodemeta *m;
  nodedata **ListItem;
  bool_t Result;
  nodeclass *Class_local;
  node *Node_local;
  nodecontext *p_local;
  
  ListItem = (nodedata **)0x1;
  for (Result = (bool_t)Class; Result != 0; Result = *(bool_t *)(Result + 0x18)) {
    if (*(long *)(Result + 8) != 0) {
      for (Ptr = *(array **)(Result + 8); ((ulong)Ptr->_Begin & 0xff) != 0; Ptr = Ptr + 1) {
        if (((ulong)Ptr->_Begin & 0xff) == 0xe) {
          (*(code *)Ptr->_Used)(Node);
        }
        else if (((ulong)Ptr->_Begin & 0xff) == 3) {
          (*(code *)Ptr->_Used)(Node,0);
        }
        else if ((((ulong)Ptr->_Begin & 0xff) == 0x5e) && (-1 < (long)Ptr->_Used)) {
          sVar1 = Ptr->_Used;
          if (((ulong)Ptr[1]._Begin & 0xff) == 2) {
            Ptr = Ptr + 1;
          }
          if (((ulong)Ptr[1]._Begin & 0xff) == 3) {
            (*(code *)Ptr[1]._Used)(Node,0);
            Ptr = Ptr + 1;
          }
          ArrayClear((array *)((long)&Node->FourCC + sVar1));
        }
        else if ((((ulong)Ptr->_Begin & 0xff) == 0x57) && (-1 < (long)Ptr->_Used)) {
          puVar2 = (undefined8 *)((long)&Node->FourCC + Ptr->_Used);
          p_00 = (thisnode)*puVar2;
          if (p_00 != (thisnode)0x0) {
            if (((ulong)Ptr[1]._Begin & 0xff) == 2) {
              Ptr = Ptr + 1;
            }
            if (((ulong)Ptr[1]._Begin & 0xff) == 3) {
              (*(code *)Ptr[1]._Used)(Node,0);
              Ptr = Ptr + 1;
            }
            *puVar2 = 0;
            Node_Release(p_00);
          }
        }
      }
    }
  }
  m = (nodemeta *)&Node->Data;
  while (*(long *)m != 0) {
    bVar3 = DataFree(p,Node,(nodedata **)m,1);
    if (bVar3 == 0) {
      m = *(nodemeta **)m;
      ListItem = (nodedata **)0x0;
    }
  }
  Node->VMT = (void *)0x0;
  return (bool_t)ListItem;
}

Assistant:

static NOINLINE bool_t CallDelete(nodecontext* p,node* Node,const nodeclass* Class)
{
    bool_t Result = 1;
    nodedata **ListItem;

    for (;Class;Class=Class->ParentClass)
        if (Class->Meta)
        {
            const nodemeta* m;
            for (m=Class->Meta;m->Meta != META_CLASS_PARENT_ID;++m)
            {
                if (m->Meta == META_CLASS_DELETE)
                    ((void(*)(node*))m->Data)(Node);
                else
                if (m->Meta == META_PARAM_DATA_RELEASE)
                    ((nodeupdatefunc)m->Data)(Node,0);
                else
                if (m->Meta == (META_MODE_DATA | TYPE_ARRAY) && (intptr_t)m->Data>=0)
                {
                    array* Ptr = (void*)((uint8_t*)Node+m->Data);
#if defined(CONFIG_CORECDOC)
                    if (m[2].Meta == META_PARAM_DATA_FLAGS)
                    {
                        ++m;
                        ++m;
                    }
                    if (m[2].Meta == META_PARAM_DATA_RELEASE)
                    {
                        ++m;
                        ++m;
                        ((nodeupdatefunc)m->Data)(Node,0);
                    }
#else
                    if (m[1].Meta == META_PARAM_DATA_FLAGS)
                        ++m;
                    if (m[1].Meta == META_PARAM_DATA_RELEASE)
                    {
                        ++m;
                        ((nodeupdatefunc)m->Data)(Node,0);
                    }
#endif
                    ArrayClear(Ptr);
                }
                else
                if (m->Meta == (META_MODE_DATA | TYPE_NODE_REF) && (intptr_t)m->Data>=0)
                {
                    node** Ptr = (void*)((uint8_t*)Node+m->Data);
                    node* v = *Ptr;
                    if (v)
                    {
#if defined(CONFIG_CORECDOC)
                        if (m[2].Meta == META_PARAM_DATA_FLAGS)
                        {
                            ++m;
                            ++m;
                        }
                        if (m[2].Meta == META_PARAM_DATA_RELEASE)
                        {
                            ++m;
                            ++m;
                            ((nodeupdatefunc)m->Data)(Node,0);
                        }
#else
                        if (m[1].Meta == META_PARAM_DATA_FLAGS)
                            ++m;
                        if (m[1].Meta == META_PARAM_DATA_RELEASE)
                        {
                            ++m;
                            ((nodeupdatefunc)m->Data)(Node,0);
                        }
#endif
                        *Ptr = NULL;
                        Node_Release(v);
                    }
                }
            }
        }

    // no need to NodeLock around DataFree(), because object in deleting
    // (other threads should not touch this object anymore)
    ListItem = &Node->Data;
    while (*ListItem)
        if (!DataFree(p,Node,ListItem,1))
        {
            ListItem = &(*ListItem)->Next; // will be deleted on Node_NotifyInternal exit
            Result = 0;
        }

    Node->VMT = NULL;
    return Result;
}